

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_demo.c
# Opt level: O3

int main(void)

{
  int iVar1;
  mbedtls_mpi Q;
  mbedtls_mpi N;
  mbedtls_mpi P;
  mbedtls_mpi E;
  mbedtls_mpi Y;
  mbedtls_mpi X;
  mbedtls_mpi D;
  mbedtls_mpi Z;
  mbedtls_mpi H;
  mbedtls_mpi local_e0;
  mbedtls_mpi local_c8;
  mbedtls_mpi local_b0;
  mbedtls_mpi local_98;
  mbedtls_mpi local_80;
  mbedtls_mpi local_68;
  mbedtls_mpi local_50;
  mbedtls_mpi local_38;
  mbedtls_mpi local_20;
  
  mbedtls_mpi_init(&local_98);
  mbedtls_mpi_init(&local_b0);
  mbedtls_mpi_init(&local_e0);
  mbedtls_mpi_init(&local_c8);
  mbedtls_mpi_init(&local_20);
  mbedtls_mpi_init(&local_50);
  mbedtls_mpi_init(&local_68);
  mbedtls_mpi_init(&local_80);
  mbedtls_mpi_init(&local_38);
  iVar1 = mbedtls_mpi_read_string(&local_b0,10,"2789");
  if ((((iVar1 == 0) && (iVar1 = mbedtls_mpi_read_string(&local_e0,10,"3203"), iVar1 == 0)) &&
      (iVar1 = mbedtls_mpi_read_string(&local_98,10,"257"), iVar1 == 0)) &&
     (iVar1 = mbedtls_mpi_mul_mpi(&local_c8,&local_b0,&local_e0), iVar1 == 0)) {
    puts("\n  Public key:\n");
    iVar1 = mbedtls_mpi_write_file("  N = ",&local_c8,10,(FILE *)0x0);
    if ((iVar1 == 0) &&
       (iVar1 = mbedtls_mpi_write_file("  E = ",&local_98,10,(FILE *)0x0), iVar1 == 0)) {
      puts("\n  Private key:\n");
      iVar1 = mbedtls_mpi_write_file("  P = ",&local_b0,10,(FILE *)0x0);
      if ((((iVar1 == 0) &&
           ((iVar1 = mbedtls_mpi_write_file("  Q = ",&local_e0,10,(FILE *)0x0), iVar1 == 0 &&
            (iVar1 = mbedtls_mpi_sub_int(&local_b0,&local_b0,1), iVar1 == 0)))) &&
          (iVar1 = mbedtls_mpi_sub_int(&local_e0,&local_e0,1), iVar1 == 0)) &&
         ((iVar1 = mbedtls_mpi_mul_mpi(&local_20,&local_b0,&local_e0), iVar1 == 0 &&
          (iVar1 = mbedtls_mpi_inv_mod(&local_50,&local_98,&local_20), iVar1 == 0)))) {
        mbedtls_mpi_write_file("  D = E^-1 mod (P-1)*(Q-1) = ",&local_50,10,(FILE *)0x0);
        iVar1 = mbedtls_mpi_read_string(&local_68,10,"55555");
        if ((iVar1 == 0) &&
           ((iVar1 = mbedtls_mpi_exp_mod(&local_80,&local_68,&local_98,&local_c8,(mbedtls_mpi *)0x0)
            , iVar1 == 0 &&
            (iVar1 = mbedtls_mpi_exp_mod(&local_38,&local_80,&local_50,&local_c8,(mbedtls_mpi *)0x0)
            , iVar1 == 0)))) {
          puts("\n  RSA operation:\n");
          iVar1 = mbedtls_mpi_write_file("  X (plaintext)  = ",&local_68,10,(FILE *)0x0);
          if ((iVar1 == 0) &&
             ((iVar1 = mbedtls_mpi_write_file
                                 ("  Y (ciphertext) = X^E mod N = ",&local_80,10,(FILE *)0x0),
              iVar1 == 0 &&
              (iVar1 = mbedtls_mpi_write_file
                                 ("  Z (decrypted)  = Y^D mod N = ",&local_38,10,(FILE *)0x0),
              iVar1 == 0)))) {
            putchar(10);
            mbedtls_mpi_free(&local_98);
            mbedtls_mpi_free(&local_b0);
            mbedtls_mpi_free(&local_e0);
            mbedtls_mpi_free(&local_c8);
            mbedtls_mpi_free(&local_20);
            mbedtls_mpi_free(&local_50);
            mbedtls_mpi_free(&local_68);
            mbedtls_mpi_free(&local_80);
            mbedtls_mpi_free(&local_38);
            return 0;
          }
        }
      }
    }
  }
  mbedtls_mpi_free(&local_98);
  mbedtls_mpi_free(&local_b0);
  mbedtls_mpi_free(&local_e0);
  mbedtls_mpi_free(&local_c8);
  mbedtls_mpi_free(&local_20);
  mbedtls_mpi_free(&local_50);
  mbedtls_mpi_free(&local_68);
  mbedtls_mpi_free(&local_80);
  mbedtls_mpi_free(&local_38);
  puts("\nAn error occurred.");
  return 1;
}

Assistant:

int main( void )
{
    int ret;
    mbedtls_mpi E, P, Q, N, H, D, X, Y, Z;

    mbedtls_mpi_init( &E ); mbedtls_mpi_init( &P ); mbedtls_mpi_init( &Q ); mbedtls_mpi_init( &N );
    mbedtls_mpi_init( &H ); mbedtls_mpi_init( &D ); mbedtls_mpi_init( &X ); mbedtls_mpi_init( &Y );
    mbedtls_mpi_init( &Z );

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &P, 10, "2789" ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &Q, 10, "3203" ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &E, 10,  "257" ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &N, &P, &Q ) );

    mbedtls_printf( "\n  Public key:\n\n" );
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "  N = ", &N, 10, NULL ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "  E = ", &E, 10, NULL ) );

    mbedtls_printf( "\n  Private key:\n\n" );
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "  P = ", &P, 10, NULL ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "  Q = ", &Q, 10, NULL ) );

#if defined(MBEDTLS_GENPRIME)
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &P, &P, 1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &Q, &Q, 1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &H, &P, &Q ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( &D, &E, &H ) );

    mbedtls_mpi_write_file( "  D = E^-1 mod (P-1)*(Q-1) = ",
                    &D, 10, NULL );
#else
    mbedtls_printf("\nTest skipped (MBEDTLS_GENPRIME not defined).\n\n");
#endif
    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &X, 10, "55555" ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &Y, &X, &E, &N, NULL ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &Z, &Y, &D, &N, NULL ) );

    mbedtls_printf( "\n  RSA operation:\n\n" );
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "  X (plaintext)  = ", &X, 10, NULL ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "  Y (ciphertext) = X^E mod N = ", &Y, 10, NULL ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "  Z (decrypted)  = Y^D mod N = ", &Z, 10, NULL ) );
    mbedtls_printf( "\n" );

cleanup:
    mbedtls_mpi_free( &E ); mbedtls_mpi_free( &P ); mbedtls_mpi_free( &Q ); mbedtls_mpi_free( &N );
    mbedtls_mpi_free( &H ); mbedtls_mpi_free( &D ); mbedtls_mpi_free( &X ); mbedtls_mpi_free( &Y );
    mbedtls_mpi_free( &Z );

    if( ret != 0 )
    {
        mbedtls_printf( "\nAn error occurred.\n" );
        ret = 1;
    }

#if defined(_WIN32)
    mbedtls_printf( "  Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( ret );
}